

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer.cc
# Opt level: O2

bool __thiscall
google::protobuf::util::MessageDifferencer::CompareRepeatedRep
          (MessageDifferencer *this,Message *message1,Message *message2,int unpacked_any,
          FieldDescriptor *repeated_field,
          vector<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
          *parent_fields)

{
  pointer *ppSVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  byte bVar7;
  uint uVar8;
  uint uVar9;
  MapKeyComparator *key_comparator;
  Nullable<const_char_*> failure_msg;
  int v2;
  int index;
  long lVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  Metadata MVar14;
  Metadata MVar15;
  int local_fc;
  vector<int,_std::allocator<int>_> match_list1;
  vector<int,_std::allocator<int>_> match_list2;
  SpecificField local_a0;
  LogMessageFatal local_40;
  
  bVar2 = FieldDescriptor::is_repeated(repeated_field);
  if (!bVar2) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_a0,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/message_differencer.cc"
               ,0x4d1,"repeated_field->is_repeated()");
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_a0);
  }
  MVar14 = Message::GetMetadata(message1);
  MVar15 = Message::GetMetadata(message2);
  uVar8 = Reflection::FieldSize(MVar14.reflection,message1,repeated_field);
  uVar9 = Reflection::FieldSize(MVar15.reflection,message2,repeated_field);
  bVar2 = IsTreatedAsSubset(this,repeated_field);
  if (this->reporter_ == (Reporter *)0x0 && (uVar8 != uVar9 && ((int)uVar9 <= (int)uVar8 || !bVar2))
     ) {
    return false;
  }
  match_list1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  match_list1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  match_list1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  match_list2.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  match_list2.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  match_list2.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  key_comparator = GetMapKeyComparator(this,repeated_field);
  bVar3 = IsTreatedAsSmartList(this,repeated_field);
  if ((key_comparator != (MapKeyComparator *)0x0) ||
     (bVar4 = IsTreatedAsSet(this,repeated_field), bVar4)) {
LAB_0027e6f0:
    bVar6 = MatchRepeatedFieldIndices
                      (this,message1,message2,unpacked_any,repeated_field,key_comparator,
                       parent_fields,&match_list1,&match_list2);
    bVar5 = false;
    bVar4 = false;
    if (!bVar6 && this->reporter_ == (Reporter *)0x0) goto LAB_0027ea6b;
  }
  else {
    bVar5 = IsTreatedAsSmartSet(this,repeated_field);
    bVar4 = true;
    if (bVar5 || bVar3) goto LAB_0027e6f0;
  }
  local_a0.unknown_field_number = -1;
  local_a0.unknown_field_type = TYPE_VARINT;
  local_a0.index = -1;
  local_a0.new_index = -1;
  local_a0.map_entry1 = (Message *)0x0;
  local_a0.map_entry2 = (Message *)0x0;
  local_a0.unknown_field_set1 = (UnknownFieldSet *)0x0;
  local_a0.unknown_field_set2 = (UnknownFieldSet *)0x0;
  local_a0.unknown_field_index1 = -1;
  local_a0.unknown_field_index2 = -1;
  local_a0.forced_compare_no_presence_ = false;
  lVar10 = 0;
  bVar7 = 0;
  local_fc = 0;
  local_a0.message1 = message1;
  local_a0.message2 = message2;
  local_a0.unpacked_any = unpacked_any;
  local_a0.field = repeated_field;
  while( true ) {
    index = (int)lVar10;
    if (((int)uVar8 <= lVar10) || ((bool)((int)uVar9 <= lVar10 & bVar4))) break;
    if ((bVar4) ||
       (match_list1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[lVar10] != -1)) {
      if (bVar3) {
        v2 = local_fc;
        for (lVar12 = (long)local_fc;
            lVar12 < match_list1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar10]; lVar12 = lVar12 + 1) {
          failure_msg = absl::lts_20250127::log_internal::Check_LEImpl(0,v2,"0 <= j");
          if (failure_msg != (Nullable<const_char_*>)0x0) {
            absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                      (&local_40,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/message_differencer.cc"
                       ,0x519,failure_msg);
            absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_40);
          }
          if (this->reporter_ == (Reporter *)0x0) goto LAB_0027ea63;
          local_a0.index = v2;
          AddSpecificNewIndex(&local_a0,message2,repeated_field,v2);
          std::
          vector<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
          ::push_back(parent_fields,&local_a0);
          (*this->reporter_->_vptr_Reporter[2])(this->reporter_,message1,message2,parent_fields);
          ppSVar1 = &(parent_fields->
                     super__Vector_base<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
                     )._M_impl.super__Vector_impl_data._M_finish;
          *ppSVar1 = *ppSVar1 + -1;
          match_list2.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[lVar12] = -2;
          v2 = v2 + 1;
          bVar7 = 1;
        }
      }
      AddSpecificIndex(&local_a0,message1,repeated_field,index);
      if (bVar4) {
        AddSpecificNewIndex(&local_a0,message2,repeated_field,index);
      }
      else {
        AddSpecificNewIndex(&local_a0,message2,repeated_field,
                            match_list1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start[lVar10]);
        local_fc = match_list1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar10] + 1;
      }
      bVar5 = CompareFieldValueUsingParentFields
                        (this,message1,message2,unpacked_any,repeated_field,index,local_a0.new_index
                         ,parent_fields);
      if (!bVar5) {
        if (this->reporter_ == (Reporter *)0x0) goto LAB_0027ea63;
        std::
        vector<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
        ::push_back(parent_fields,&local_a0);
        (*this->reporter_->_vptr_Reporter[4])(this->reporter_,message1,message2,parent_fields);
        ppSVar1 = &(parent_fields->
                   super__Vector_base<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
        *ppSVar1 = *ppSVar1 + -1;
        goto LAB_0027ea54;
      }
      if (this->reporter_ == (Reporter *)0x0) {
LAB_0027e9b0:
        if ((this->report_matches_ != true) || (this->reporter_ == (Reporter *)0x0))
        goto LAB_0027ea5b;
        std::
        vector<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
        ::push_back(parent_fields,&local_a0);
        (*this->reporter_->_vptr_Reporter[6])(this->reporter_,message1,message2,parent_fields);
      }
      else {
        if (((local_a0.index == local_a0.new_index) ||
            (bVar5 = FieldDescriptor::is_map(local_a0.field), bVar5)) ||
           (this->report_moves_ != true)) goto LAB_0027e9b0;
        std::
        vector<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
        ::push_back(parent_fields,&local_a0);
        (*this->reporter_->_vptr_Reporter[5])(this->reporter_,message1,message2,parent_fields);
      }
      ppSVar1 = &(parent_fields->
                 super__Vector_base<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      *ppSVar1 = *ppSVar1 + -1;
    }
    else if (bVar3) {
      if (this->reporter_ == (Reporter *)0x0) {
LAB_0027ea63:
        bVar5 = false;
        goto LAB_0027ea6b;
      }
      AddSpecificIndex(&local_a0,message1,repeated_field,index);
      std::
      vector<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
      ::push_back(parent_fields,&local_a0);
      (*this->reporter_->_vptr_Reporter[3])(this->reporter_,message1,message2,parent_fields);
      ppSVar1 = &(parent_fields->
                 super__Vector_base<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      *ppSVar1 = *ppSVar1 + -1;
      match_list1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[lVar10] = -2;
LAB_0027ea54:
      bVar7 = 1;
    }
LAB_0027ea5b:
    lVar10 = lVar10 + 1;
  }
  uVar11 = 0;
  uVar13 = (ulong)uVar9;
  if ((int)uVar9 < 1) {
    uVar13 = uVar11;
  }
  for (; uVar13 != uVar11; uVar11 = uVar11 + 1) {
    if (bVar4) {
      if ((long)(int)uVar8 <= (long)uVar11) {
LAB_0027eacf:
        bVar7 = bVar7 | !bVar2;
        if (this->reporter_ != (Reporter *)0x0) {
          local_a0.index = (int)uVar11;
          AddSpecificNewIndex(&local_a0,message2,repeated_field,(int)uVar11);
          std::
          vector<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
          ::push_back(parent_fields,&local_a0);
          (*this->reporter_->_vptr_Reporter[2])(this->reporter_,message1,message2,parent_fields);
          ppSVar1 = &(parent_fields->
                     super__Vector_base<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
                     )._M_impl.super__Vector_impl_data._M_finish;
          *ppSVar1 = *ppSVar1 + -1;
        }
      }
    }
    else if (match_list2.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start[uVar11] == -1) goto LAB_0027eacf;
  }
  uVar11 = 0;
  uVar13 = (ulong)uVar8;
  if ((int)uVar8 < 1) {
    uVar13 = uVar11;
  }
  for (; uVar13 != uVar11; uVar11 = uVar11 + 1) {
    if (bVar4) {
      if ((long)(int)uVar9 <= (long)uVar11) {
LAB_0027eb61:
        if (this->reporter_ == (Reporter *)0x0) {
          __assert_fail("reporter_ != nullptr",
                        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/message_differencer.cc"
                        ,0x55b,
                        "bool google::protobuf::util::MessageDifferencer::CompareRepeatedRep(const Message &, const Message &, int, const FieldDescriptor *, std::vector<SpecificField> *)"
                       );
        }
        AddSpecificIndex(&local_a0,message1,repeated_field,(int)uVar11);
        std::
        vector<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
        ::push_back(parent_fields,&local_a0);
        (*this->reporter_->_vptr_Reporter[3])(this->reporter_,message1,message2,parent_fields);
        ppSVar1 = &(parent_fields->
                   super__Vector_base<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
        *ppSVar1 = *ppSVar1 + -1;
        bVar7 = 1;
      }
    }
    else if (match_list1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start[uVar11] == -1) goto LAB_0027eb61;
  }
  bVar5 = (bool)(bVar7 ^ 1);
LAB_0027ea6b:
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&match_list2.super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&match_list1.super__Vector_base<int,_std::allocator<int>_>);
  return bVar5;
}

Assistant:

bool MessageDifferencer::CompareRepeatedRep(
    const Message& message1, const Message& message2, int unpacked_any,
    const FieldDescriptor* repeated_field,
    std::vector<SpecificField>* parent_fields) {
  // the input FieldDescriptor is guaranteed to be repeated field.
  ABSL_DCHECK(repeated_field->is_repeated());
  const Reflection* reflection1 = message1.GetReflection();
  const Reflection* reflection2 = message2.GetReflection();

  const int count1 = reflection1->FieldSize(message1, repeated_field);
  const int count2 = reflection2->FieldSize(message2, repeated_field);
  const bool treated_as_subset = IsTreatedAsSubset(repeated_field);

  // If the field is not treated as subset and no detailed reports is needed,
  // we do a quick check on the number of the elements to avoid unnecessary
  // comparison.
  if (count1 != count2 && reporter_ == nullptr && !treated_as_subset) {
    return false;
  }
  // A match can never be found if message1 has more items than message2.
  if (count1 > count2 && reporter_ == nullptr) {
    return false;
  }

  // These two list are used for store the index of the correspondent
  // element in peer repeated field.
  std::vector<int> match_list1;
  std::vector<int> match_list2;

  const MapKeyComparator* key_comparator = GetMapKeyComparator(repeated_field);
  bool smart_list = IsTreatedAsSmartList(repeated_field);
  bool simple_list = key_comparator == nullptr &&
                     !IsTreatedAsSet(repeated_field) &&
                     !IsTreatedAsSmartSet(repeated_field) && !smart_list;

  // For simple lists, we avoid matching repeated field indices, saving the
  // memory allocations that would otherwise be needed for match_list1 and
  // match_list2.
  if (!simple_list) {
    // Try to match indices of the repeated fields. Return false if match fails.
    if (!MatchRepeatedFieldIndices(
            message1, message2, unpacked_any, repeated_field, key_comparator,
            *parent_fields, &match_list1, &match_list2) &&
        reporter_ == nullptr) {
      return false;
    }
  }

  bool fieldDifferent = false;
  SpecificField specific_field;
  specific_field.message1 = &message1;
  specific_field.message2 = &message2;
  specific_field.unpacked_any = unpacked_any;
  specific_field.field = repeated_field;

  // At this point, we have already matched pairs of fields (with the reporting
  // to be done later). Now to check if the paired elements are different.
  int next_unmatched_index = 0;
  for (int i = 0; i < count1; i++) {
    if (simple_list && i >= count2) {
      break;
    }
    if (!simple_list && match_list1[i] == -1) {
      if (smart_list) {
        if (reporter_ == nullptr) return false;
        AddSpecificIndex(&specific_field, message1, repeated_field, i);
        parent_fields->push_back(specific_field);
        reporter_->ReportDeleted(message1, message2, *parent_fields);
        parent_fields->pop_back();
        fieldDifferent = true;
        // Use -2 to mark this element has been reported.
        match_list1[i] = -2;
      }
      continue;
    }
    if (smart_list) {
      for (int j = next_unmatched_index; j < match_list1[i]; ++j) {
        ABSL_CHECK_LE(0, j);
        if (reporter_ == nullptr) return false;
        specific_field.index = j;
        AddSpecificNewIndex(&specific_field, message2, repeated_field, j);
        parent_fields->push_back(specific_field);
        reporter_->ReportAdded(message1, message2, *parent_fields);
        parent_fields->pop_back();
        fieldDifferent = true;
        // Use -2 to mark this element has been reported.
        match_list2[j] = -2;
      }
    }
    AddSpecificIndex(&specific_field, message1, repeated_field, i);
    if (simple_list) {
      AddSpecificNewIndex(&specific_field, message2, repeated_field, i);
    } else {
      AddSpecificNewIndex(&specific_field, message2, repeated_field,
                          match_list1[i]);
      next_unmatched_index = match_list1[i] + 1;
    }

    const bool result = CompareFieldValueUsingParentFields(
        message1, message2, unpacked_any, repeated_field, i,
        specific_field.new_index, parent_fields);

    // If we have found differences, either report them or terminate if
    // no reporter is present. Note that ReportModified, ReportMoved, and
    // ReportMatched are all mutually exclusive.
    if (!result) {
      if (reporter_ == nullptr) return false;
      parent_fields->push_back(specific_field);
      reporter_->ReportModified(message1, message2, *parent_fields);
      parent_fields->pop_back();
      fieldDifferent = true;
    } else if (reporter_ != nullptr &&
               specific_field.index != specific_field.new_index &&
               !specific_field.field->is_map() && report_moves_) {
      parent_fields->push_back(specific_field);
      reporter_->ReportMoved(message1, message2, *parent_fields);
      parent_fields->pop_back();
    } else if (report_matches_ && reporter_ != nullptr) {
      parent_fields->push_back(specific_field);
      reporter_->ReportMatched(message1, message2, *parent_fields);
      parent_fields->pop_back();
    }
  }

  // Report any remaining additions or deletions.
  for (int i = 0; i < count2; ++i) {
    if (!simple_list && match_list2[i] != -1) continue;
    if (simple_list && i < count1) continue;
    if (!treated_as_subset) {
      fieldDifferent = true;
    }

    if (reporter_ == nullptr) continue;
    specific_field.index = i;
    AddSpecificNewIndex(&specific_field, message2, repeated_field, i);
    parent_fields->push_back(specific_field);
    reporter_->ReportAdded(message1, message2, *parent_fields);
    parent_fields->pop_back();
  }

  for (int i = 0; i < count1; ++i) {
    if (!simple_list && match_list1[i] != -1) continue;
    if (simple_list && i < count2) continue;
    assert(reporter_ != nullptr);
    AddSpecificIndex(&specific_field, message1, repeated_field, i);
    parent_fields->push_back(specific_field);
    reporter_->ReportDeleted(message1, message2, *parent_fields);
    parent_fields->pop_back();
    fieldDifferent = true;
  }
  return !fieldDifferent;
}